

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::Limits> *
wasm::WATParser::limits64<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::Limits> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  optional<unsigned_long> oVar4;
  Limits local_a8;
  _Storage<unsigned_long,_true> local_90;
  optional<unsigned_long> m;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  _Storage<unsigned_long,_true> local_28;
  optional<unsigned_long> n;
  ParseDeclsCtx *ctx_local;
  
  n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = ctx;
  oVar4 = Lexer::takeU64(&ctx->in);
  local_28._M_value =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_28);
  uVar1 = n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_8_;
  if (bVar2) {
    oVar4 = Lexer::takeU64((Lexer *)n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_long>._8_8_);
    uVar1 = n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
    local_90._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    m.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_28);
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (bool)m.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_90._M_value;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    ParseDeclsCtx::makeLimits(&local_a8,(ParseDeclsCtx *)uVar1,*puVar3,oVar4);
    Result<wasm::WATParser::Limits>::Result<wasm::WATParser::Limits>
              (__return_storage_ptr__,&local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected initial size",&local_69);
    Lexer::err(&local_48,(Lexer *)uVar1,&local_68);
    Result<wasm::WATParser::Limits>::Result(__return_storage_ptr__,&local_48);
    wasm::Err::~Err(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits64(Ctx& ctx) {
  auto n = ctx.in.takeU64();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU64();
  return ctx.makeLimits(uint64_t(*n), m);
}